

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dma_write.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  nettlp *__buf;
  char *__s;
  uint16_t devn;
  uint16_t busn;
  uintptr_t addr;
  nettlp nt;
  char buf [4096];
  ushort local_1068;
  short local_1066;
  int local_1064;
  uintptr_t local_1060;
  nettlp local_1058;
  char local_1038 [4104];
  
  local_1058.remote_addr.s_addr = 0;
  local_1058.local_addr.s_addr = 0;
  local_1058.requester = 0;
  local_1058.tag = '\0';
  local_1058._11_1_ = 0;
  local_1058.dir = DMA_ISSUED_BY_LIBTLP;
  local_1058.sockfd = 0;
  local_1058.port = 0;
  local_1058._22_2_ = 0;
  local_1060 = 0;
  local_1066 = 0;
  local_1068 = 0;
  uVar2 = 0;
  local_1064 = 0;
LAB_001024c4:
  iVar1 = getopt(argc,argv,"r:l:b:t:a:s:p:m:");
  switch(iVar1) {
  case 0x61:
    __isoc99_sscanf(_optarg,"0x%lx",&local_1060);
    goto LAB_001024c4;
  case 0x62:
    __isoc99_sscanf(_optarg,"%hx:%hx",&local_1066,&local_1068);
    local_1058.requester = local_1066 << 8 | local_1068;
    goto LAB_001024c4;
  case 0x6c:
    __buf = (nettlp *)&local_1058.local_addr;
    break;
  case 0x6d:
    local_1064 = atoi(_optarg);
    goto LAB_001024c4;
  case 0x70:
    strncpy(local_1038,_optarg,0x1000);
    goto LAB_001024c4;
  case 0x72:
    __buf = &local_1058;
    break;
  case 0x73:
    goto switchD_001024e5_caseD_73;
  case 0x74:
    iVar1 = atoi(_optarg);
    local_1058.tag = (uint8_t)iVar1;
    goto LAB_001024c4;
  default:
    if (iVar1 == -1) {
      iVar1 = nettlp_init(&local_1058);
      if (iVar1 < 0) {
        __s = "nettlp_init";
      }
      else {
        dump_nettlp(&local_1058);
        printf("start DMA write, to 0x%lx, payload=\'%s\', size %d-byte\n",local_1060,local_1038,
               (ulong)uVar2);
        if (local_1064 == 0) {
          uVar3 = dma_write(&local_1058,local_1060,local_1038,(long)(int)uVar2);
        }
        else {
          uVar3 = dma_write_aligned(&local_1058,local_1060,local_1038,(long)(int)uVar2,
                                    (long)local_1064);
        }
        iVar1 = 0;
        printf("dma_write to 0x%lx returns %d\n",local_1060,uVar3 & 0xffffffff);
        if (-1 < (int)uVar3) {
          return 0;
        }
        __s = "dma_read";
      }
      perror(__s);
      return iVar1;
    }
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x71:
    puts(
        "usage\n    -r remote addr at NetTLP link\n    -l local addr at NetTLP link\n    -b bus number of NetTLP adapter, XX:XX\n    -t tag\n    -a dma address, 0xHEXADDR\n    -s size\n    -p payload as ascii string (default )\n    -m MaxPayloadSize"
        );
    return -1;
  }
  iVar1 = inet_pton(2,_optarg,__buf);
  if (iVar1 < 1) {
    perror("inet_pton");
    return -1;
  }
  goto LAB_001024c4;
switchD_001024e5_caseD_73:
  uVar2 = atoi(_optarg);
  if (0x1000 < (int)uVar2) {
    main_cold_1();
    return -1;
  }
  goto LAB_001024c4;
}

Assistant:

int main(int argc, char **argv)
{
	int ret, ch, size, mps;
	struct nettlp nt;
	uintptr_t addr;
	uint16_t busn, devn;
	char buf[4096];

	memset(&nt, 0, sizeof(nt));
	addr = 0;
	busn = 0;
	devn = 0;
	mps = 0;

	size = 0;

	while ((ch = getopt(argc, argv, "r:l:b:t:a:s:p:m:")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &nt.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &nt.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'b':
			ret = sscanf(optarg, "%hx:%hx", &busn, &devn);
			nt.requester = (busn << 8 | devn);
			break;

		case 't':
			nt.tag = atoi(optarg);
			break;

		case 'a':
			ret = sscanf(optarg, "0x%lx", &addr);
			break;

		case 'p':
			strncpy(buf, optarg, sizeof(buf));
			break;

		case 's':
			size = atoi(optarg);
			if (size > 4096) {
				fprintf(stderr, "too large size\n");
				return -1;
			}
			break;

		case 'm':
			mps = atoi(optarg);
			break;

		default :
			usage();
			return -1;
		}
	}

	ret = nettlp_init(&nt);
	if (ret < 0) {
		perror("nettlp_init");
		return ret;
	}
	dump_nettlp(&nt);

	printf("start DMA write, to 0x%lx, payload='%s', size %d-byte\n",
	       addr, buf, size);

	if (mps)
		ret = dma_write_aligned(&nt, addr, buf, size, mps);
	else
		ret = dma_write(&nt, addr, buf, size);

	printf("dma_write to 0x%lx returns %d\n", addr, ret);

	if (ret < 0)
		perror("dma_read");


	return 0;
}